

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::AddPeginTxIn
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Amount *amount,
          ConfidentialAssetId *asset_id,BlockHash *mainchain_genesis_block_hash,Script *claim_script
          ,ByteData *mainchain_pegin_transaction,ByteData *tx_out_proof)

{
  uint32_t uVar1;
  bool bVar2;
  ConfidentialAssetId *in_RCX;
  Amount *in_RDX;
  undefined8 in_RSI;
  ConfidentialTransaction *in_RDI;
  BlockHash *in_R8;
  Script *in_R9;
  ByteData *in_stack_00000008;
  ByteData *in_stack_00000010;
  uint32_t index;
  pointer in_stack_fffffffffffffea8;
  OutPoint *in_stack_fffffffffffffeb0;
  ConfidentialTransactionContext *in_stack_fffffffffffffeb8;
  ByteData local_128;
  ScriptWitness local_110;
  ByteData local_f0;
  ScriptWitness local_d8;
  ByteData local_b8;
  ScriptWitness local_a0;
  ByteData local_70;
  ScriptWitness local_58;
  uint32_t local_34;
  Script *local_30;
  BlockHash *local_28;
  ConfidentialAssetId *local_20;
  Amount *local_18;
  undefined8 local_10;
  
  local_34 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = IsFindTxIn(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                     (uint32_t *)in_stack_fffffffffffffea8);
  if (!bVar2) {
    local_34 = (*(in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction[0x11])
                         (in_RDI,local_10);
  }
  uVar1 = local_34;
  core::Amount::GetByteData(&local_70,local_18);
  core::ConfidentialTransaction::AddPeginWitnessStack(&local_58,in_RDI,uVar1,&local_70);
  core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x5522d4);
  core::ByteData::~ByteData((ByteData *)0x5522e1);
  uVar1 = local_34;
  core::ConfidentialAssetId::GetUnblindedData(&local_b8,local_20);
  core::ConfidentialTransaction::AddPeginWitnessStack(&local_a0,in_RDI,uVar1,&local_b8);
  core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x552330);
  core::ByteData::~ByteData((ByteData *)0x55233d);
  uVar1 = local_34;
  core::BlockHash::GetData(&local_f0,local_28);
  core::ConfidentialTransaction::AddPeginWitnessStack(&local_d8,in_RDI,uVar1,&local_f0);
  core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x55238c);
  core::ByteData::~ByteData((ByteData *)0x552399);
  uVar1 = local_34;
  core::Script::GetData(&local_128,local_30);
  core::ConfidentialTransaction::AddPeginWitnessStack(&local_110,in_RDI,uVar1,&local_128);
  core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x5523e8);
  core::ByteData::~ByteData((ByteData *)0x5523f5);
  core::ConfidentialTransaction::AddPeginWitnessStack
            ((ScriptWitness *)&stack0xfffffffffffffeb8,in_RDI,local_34,in_stack_00000008);
  core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x55241d);
  core::ConfidentialTransaction::AddPeginWitnessStack
            ((ScriptWitness *)&stack0xfffffffffffffe98,in_RDI,local_34,in_stack_00000010);
  core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x552445);
  return;
}

Assistant:

void ConfidentialTransactionContext::AddPeginTxIn(  // AddPeginWitness
    const OutPoint& outpoint, const Amount& amount,
    const ConfidentialAssetId& asset_id,
    const BlockHash& mainchain_genesis_block_hash, const Script& claim_script,
    const ByteData& mainchain_pegin_transaction,
    const ByteData& tx_out_proof) {
  uint32_t index = 0;
  if (!IsFindTxIn(outpoint, &index)) {
    index = AddTxIn(outpoint);
  }
  AddPeginWitnessStack(index, amount.GetByteData());
  AddPeginWitnessStack(index, asset_id.GetUnblindedData());
  AddPeginWitnessStack(index, mainchain_genesis_block_hash.GetData());
  AddPeginWitnessStack(index, claim_script.GetData());
  AddPeginWitnessStack(index, mainchain_pegin_transaction);
  AddPeginWitnessStack(index, tx_out_proof);
}